

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lhash.cc
# Opt level: O1

void OPENSSL_lh_free(_LHASH *lh)

{
  lhash_item_st *plVar1;
  LHASH_ITEM *orig_ptr;
  ulong uVar2;
  
  if (lh == (_LHASH *)0x0) {
    return;
  }
  if (lh->num_buckets != 0) {
    uVar2 = 0;
    do {
      orig_ptr = lh->buckets[uVar2];
      while (orig_ptr != (LHASH_ITEM *)0x0) {
        plVar1 = orig_ptr->next;
        OPENSSL_free(orig_ptr);
        orig_ptr = plVar1;
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 < lh->num_buckets);
  }
  OPENSSL_free(lh->buckets);
  OPENSSL_free(lh);
  return;
}

Assistant:

void OPENSSL_lh_free(_LHASH *lh) {
  if (lh == NULL) {
    return;
  }

  for (size_t i = 0; i < lh->num_buckets; i++) {
    LHASH_ITEM *next;
    for (LHASH_ITEM *n = lh->buckets[i]; n != NULL; n = next) {
      next = n->next;
      OPENSSL_free(n);
    }
  }

  OPENSSL_free(lh->buckets);
  OPENSSL_free(lh);
}